

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_maketables.c
# Opt level: O3

uint8_t * coda_pcre2_maketables_8(pcre2_general_context_8 *gcontext)

{
  ushort uVar1;
  uint8_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  ushort **ppuVar5;
  byte *pbVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_48;
  
  if (gcontext == (pcre2_general_context_8 *)0x0) {
    puVar4 = (uint8_t *)malloc(0x440);
  }
  else {
    puVar4 = (uint8_t *)(*(gcontext->memctl).malloc)(0x440,(gcontext->memctl).memory_data);
  }
  if (puVar4 != (uint8_t *)0x0) {
    lVar12 = 0;
    do {
      iVar3 = tolower((int)lVar12);
      puVar4[lVar12] = (uint8_t)iVar3;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x100);
    local_68 = 0x40;
    local_70 = 0x60;
    local_78 = 0x80;
    local_80 = 0xa0;
    lVar13 = 0x20;
    lVar10 = 0xc0;
    lVar11 = 0xe0;
    lVar12 = 0x100;
    local_48 = 0x120;
    ppuVar5 = __ctype_b_loc();
    lVar14 = 0;
    do {
      if ((*(byte *)((long)*ppuVar5 + lVar14 * 2 + 1) & 2) == 0) {
        iVar3 = tolower((int)lVar14);
      }
      else {
        iVar3 = toupper((int)lVar14);
      }
      uVar2 = (uint8_t)iVar3;
      if (0xff < iVar3) {
        uVar2 = (uint8_t)lVar14;
      }
      puVar4[lVar14 + 0x100] = uVar2;
      lVar14 = lVar14 + 1;
      local_68 = local_68 + 1;
      local_70 = local_70 + 1;
      local_78 = local_78 + 1;
      local_80 = local_80 + 1;
      lVar13 = lVar13 + 1;
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 1;
      local_48 = local_48 + 1;
    } while (lVar14 != 0x100);
    uVar7 = 0;
    memset(puVar4 + 0x200,0,0x140);
    do {
      uVar1 = (*ppuVar5)[uVar7];
      bVar9 = (byte)uVar7;
      if ((uVar1 >> 0xb & 1) != 0) {
        puVar4[local_68 + (ulong)((uint)(uVar7 >> 3) & 0x1fffffbf) + 0x100] =
             puVar4[local_68 + (ulong)((uint)(uVar7 >> 3) & 0x1fffffbf) + 0x100] |
             '\x01' << (bVar9 & 7);
        uVar1 = (*ppuVar5)[uVar7];
      }
      if ((uVar1 >> 8 & 1) != 0) {
        puVar4[local_70 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff9f) + 0x100] =
             puVar4[local_70 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff9f) + 0x100] |
             '\x01' << (bVar9 & 7);
        uVar1 = (*ppuVar5)[uVar7];
      }
      if ((uVar1 >> 9 & 1) != 0) {
        puVar4[local_78 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff7f) + 0x100] =
             puVar4[local_78 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff7f) + 0x100] |
             '\x01' << (bVar9 & 7);
        uVar1 = (*ppuVar5)[uVar7];
      }
      if ((uVar1 & 8) != 0) {
        puVar4[local_80 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff5f) + 0x100] =
             puVar4[local_80 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff5f) + 0x100] |
             '\x01' << (bVar9 & 7);
      }
      if (uVar7 == 0x5f) {
        puVar4[0x2ab] = puVar4[0x2ab] | 0x80;
      }
      uVar1 = (*ppuVar5)[uVar7];
      if ((uVar1 >> 0xd & 1) != 0) {
        puVar4[(uVar7 >> 3) + 0x200] = '\x01' << (bVar9 & 7) | puVar4[(uVar7 >> 3) + 0x200];
        uVar1 = (*ppuVar5)[uVar7];
      }
      if ((uVar1 >> 0xc & 1) != 0) {
        puVar4[lVar13 + (ulong)((uint)(uVar7 >> 3) & 0x1fffffdf) + 0x100] =
             puVar4[lVar13 + (ulong)((uint)(uVar7 >> 3) & 0x1fffffdf) + 0x100] |
             '\x01' << (bVar9 & 7);
        uVar1 = (*ppuVar5)[uVar7];
      }
      if ((short)uVar1 < 0) {
        puVar4[lVar10 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff3f) + 0x100] =
             puVar4[lVar10 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff3f) + 0x100] |
             '\x01' << (bVar9 & 7);
        uVar1 = (*ppuVar5)[uVar7];
      }
      if ((uVar1 >> 0xe & 1) != 0) {
        puVar4[lVar11 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff1f) + 0x100] =
             puVar4[lVar11 + (ulong)((uint)(uVar7 >> 3) & 0x1fffff1f) + 0x100] |
             '\x01' << (bVar9 & 7);
        uVar1 = (*ppuVar5)[uVar7];
      }
      if ((uVar1 & 4) != 0) {
        puVar4[lVar12 + (ulong)((uint)(uVar7 >> 3) & 0x1ffffeff) + 0x100] =
             puVar4[lVar12 + (ulong)((uint)(uVar7 >> 3) & 0x1ffffeff) + 0x100] |
             '\x01' << (bVar9 & 7);
        uVar1 = (*ppuVar5)[uVar7];
      }
      if ((uVar1 & 2) != 0) {
        puVar4[(ulong)((uint)(uVar7 >> 3) & 0x1ffffedf) + local_48 + 0x100] =
             puVar4[(ulong)((uint)(uVar7 >> 3) & 0x1ffffedf) + local_48 + 0x100] |
             '\x01' << (bVar9 & 7);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x100);
    pbVar6 = puVar4 + 0x340;
    lVar12 = 0;
    do {
      uVar1 = (*ppuVar5)[lVar12];
      bVar9 = (byte)(uVar1 >> 8);
      bVar9 = bVar9 & 8 | (byte)(uVar1 >> 7) & 4 | bVar9 >> 1 & 2 | bVar9 >> 5 & 1;
      bVar8 = bVar9 + 0x10;
      if ((uVar1 & 8) != 0) {
        bVar9 = bVar8;
      }
      if (lVar12 == 0x5f) {
        bVar9 = bVar8;
      }
      *pbVar6 = bVar9;
      pbVar6 = pbVar6 + 1;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x100);
  }
  return puVar4;
}

Assistant:

PCRE2_EXP_DEFN const uint8_t * PCRE2_CALL_CONVENTION
pcre2_maketables(pcre2_general_context *gcontext)
{
uint8_t *yield = (uint8_t *)((gcontext != NULL)?
  gcontext->memctl.malloc(TABLES_LENGTH, gcontext->memctl.memory_data) :
  malloc(TABLES_LENGTH));
#endif  /* PCRE2_DFTABLES */

int i;
uint8_t *p;

if (yield == NULL) return NULL;
p = yield;

/* First comes the lower casing table */

for (i = 0; i < 256; i++) *p++ = tolower(i);

/* Next the case-flipping table */

for (i = 0; i < 256; i++)
  {
  int c = islower(i)? toupper(i) : tolower(i);
  *p++ = (c < 256)? c : i;
  }

/* Then the character class tables. Don't try to be clever and save effort on
exclusive ones - in some locales things may be different.

Note that the table for "space" includes everything "isspace" gives, including
VT in the default locale. This makes it work for the POSIX class [:space:].
From PCRE1 release 8.34 and for all PCRE2 releases it is also correct for Perl
space, because Perl added VT at release 5.18.

Note also that it is possible for a character to be alnum or alpha without
being lower or upper, such as "male and female ordinals" (\xAA and \xBA) in the
fr_FR locale (at least under Debian Linux's locales as of 12/2005). So we must
test for alnum specially. */

memset(p, 0, cbit_length);
for (i = 0; i < 256; i++)
  {
  if (isdigit(i))  p[cbit_digit  + i/8] |= 1u << (i&7);
  if (isupper(i))  p[cbit_upper  + i/8] |= 1u << (i&7);
  if (islower(i))  p[cbit_lower  + i/8] |= 1u << (i&7);
  if (isalnum(i))  p[cbit_word   + i/8] |= 1u << (i&7);
  if (i == '_')    p[cbit_word   + i/8] |= 1u << (i&7);
  if (isspace(i))  p[cbit_space  + i/8] |= 1u << (i&7);
  if (isxdigit(i)) p[cbit_xdigit + i/8] |= 1u << (i&7);
  if (isgraph(i))  p[cbit_graph  + i/8] |= 1u << (i&7);
  if (isprint(i))  p[cbit_print  + i/8] |= 1u << (i&7);
  if (ispunct(i))  p[cbit_punct  + i/8] |= 1u << (i&7);
  if (iscntrl(i))  p[cbit_cntrl  + i/8] |= 1u << (i&7);
  }
p += cbit_length;

/* Finally, the character type table. In this, we used to exclude VT from the
white space chars, because Perl didn't recognize it as such for \s and for
comments within regexes. However, Perl changed at release 5.18, so PCRE1
changed at release 8.34 and it's always been this way for PCRE2. */

for (i = 0; i < 256; i++)
  {
  int x = 0;
  if (isspace(i)) x += ctype_space;
  if (isalpha(i)) x += ctype_letter;
  if (islower(i)) x += ctype_lcletter;
  if (isdigit(i)) x += ctype_digit;
  if (isalnum(i) || i == '_') x += ctype_word;
  *p++ = x;
  }

return yield;
}